

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::StartMouseMovingWindow(ImGuiWindow *window)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *in_RDI;
  ImVec2 IVar3;
  ImGuiWindow *unaff_retaddr;
  bool can_move_window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffd8;
  
  pIVar2 = GImGui;
  FocusWindow(unaff_retaddr);
  SetActiveID(in_RDI->MoveId,in_RDI);
  pIVar2->NavDisableHighlight = true;
  pIVar2->ActiveIdNoClearOnFocusLoss = true;
  IVar3 = operator-(in_stack_ffffffffffffffd8,(ImVec2 *)0x12e2c8);
  pIVar2->ActiveIdClickOffset = IVar3;
  bVar1 = true;
  if (((in_RDI->Flags & 4U) != 0) || ((in_RDI->RootWindow->Flags & 4U) != 0)) {
    bVar1 = false;
  }
  if (bVar1) {
    pIVar2->MovingWindow = in_RDI;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindow(ImGuiWindow* window)
{
    // Set ActiveId even if the _NoMove flag is set. Without it, dragging away from a window with _NoMove would activate hover on other windows.
    // We _also_ call this when clicking in a window empty space when io.ConfigWindowsMoveFromTitleBarOnly is set, but clear g.MovingWindow afterward.
    // This is because we want ActiveId to be set even when the window is not permitted to move.
    ImGuiContext& g = *GImGui;
    FocusWindow(window);
    SetActiveID(window->MoveId, window);
    g.NavDisableHighlight = true;
    g.ActiveIdNoClearOnFocusLoss = true;
    g.ActiveIdClickOffset = g.IO.MousePos - window->RootWindow->Pos;

    bool can_move_window = true;
    if ((window->Flags & ImGuiWindowFlags_NoMove) || (window->RootWindow->Flags & ImGuiWindowFlags_NoMove))
        can_move_window = false;
    if (can_move_window)
        g.MovingWindow = window;
}